

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::inv_erfc<float>(float x)

{
  bool bVar1;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  double dVar4;
  float u;
  float e;
  float y;
  bool flag;
  float in_stack_ffffffffffffffe0;
  undefined4 local_1c;
  undefined4 local_c;
  undefined4 local_4;
  
  local_4 = in_XMM0_Da;
  if (1.0 < in_XMM0_Da) {
    local_4 = -(in_XMM0_Da - 1.0) + 1.0;
  }
  fVar2 = inv_Phi_approx<float>(in_stack_ffffffffffffffe0);
  local_c = -fVar2 * 0.70710677;
  bVar1 = std::isfinite(local_c);
  if (bVar1) {
    dVar3 = std::erfc((double)(ulong)(uint)local_c);
    dVar4 = std::exp((double)(ulong)(uint)(local_c * local_c));
    fVar2 = -(SUB84(dVar3,0) - local_4) * 0.88622695 * SUB84(dVar4,0);
    local_c = local_c - fVar2 / (local_c * fVar2 + 1.0);
  }
  if (1.0 < in_XMM0_Da) {
    local_1c = -local_c;
  }
  else {
    local_1c = local_c;
  }
  return local_1c;
}

Assistant:

TRNG_CUDA_ENABLE T inv_erfc(T x) {
        // step size in the Halley step is proportional to erfc, use symmetry to increase
        // numerical accuracy
        const bool flag{x > 1};
        if (flag)
          x = -(x - 1) + 1;
        T y{-inv_Phi_approx(x / 2) * constants<T>::one_over_sqrt_2};
        // refinement by Halley rational method
        if (isfinite(y)) {
          const T e{erfc(y) - x};
          const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
          y -= u / (1 + y * u);
        }
        // T is a floating point number type with more than 80 bits, a 2nd iteration is
        // required to reach full machine precision
#if __cplusplus >= 201703L
        if constexpr (sizeof(T) > 10) {
#else
#if _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4127)
#endif
        if (sizeof(T) > 10) {
#if _MSC_VER
#pragma warning(pop)
#endif
#endif
          if (isfinite(y)) {
            const T e{erfc(y) - x};
            const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
            y -= u / (1 + y * u);
          }
        }
        return flag ? -y : y;
      }

    }